

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AddPageSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 *this,DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                       *segmentList)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  
  iVar3 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x365,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  segment = AllocPageSegment(segmentList,this,true,false,this->enableWriteBarrier);
  if (segment != (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
    LogAllocSegment(this,&segment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    AddFreePageCount(this,this->maxAllocPageCount);
  }
  return segment;
}

Assistant:

TPageSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AddPageSegment(DListBase<TPageSegment>& segmentList)
{
    Assert(!this->HasMultiThreadAccess());

    TPageSegment * segment = AllocPageSegment(segmentList, this, true, false, this->enableWriteBarrier);

    if (segment != nullptr)
    {
        this->LogAllocSegment(segment);
        this->AddFreePageCount(this->maxAllocPageCount);
    }
    return segment;
}